

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

int archive_read_support_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  void *signature_00;
  char *pcVar2;
  char *in_RSI;
  archive *in_RDI;
  program_bidder *state;
  archive_read_filter_bidder *bidder;
  archive_read *a;
  size_t in_stack_ffffffffffffffb8;
  archive_read_filter_bidder **in_stack_ffffffffffffffc0;
  archive_read *in_stack_ffffffffffffffc8;
  archive *bidder_00;
  
  bidder_00 = in_RDI;
  iVar1 = __archive_read_get_bidder(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (iVar1 == 0) {
    signature_00 = calloc(1,0x28);
    if (signature_00 != (void *)0x0) {
      pcVar2 = strdup(in_RSI);
      *(char **)((long)signature_00 + 8) = pcVar2;
      if (*(long *)((long)signature_00 + 8) != 0) {
        iVar1 = set_bidder_signature
                          ((archive_read_filter_bidder *)bidder_00,
                           (program_bidder *)in_stack_ffffffffffffffc8,signature_00,
                           in_stack_ffffffffffffffb8);
        return iVar1;
      }
    }
    free_state((program_bidder *)0x1324de);
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
  }
  return -0x1e;
}

Assistant:

int
archive_read_support_filter_program_signature(struct archive *_a,
    const char *cmd, const void *signature, size_t signature_len)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *bidder;
	struct program_bidder *state;

	/*
	 * Get a bidder object from the read core.
	 */
	if (__archive_read_get_bidder(a, &bidder) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Allocate our private state.
	 */
	state = (struct program_bidder *)calloc(1, sizeof (*state));
	if (state == NULL)
		goto memerr;
	state->cmd = strdup(cmd);
	if (state->cmd == NULL)
		goto memerr;

	return set_bidder_signature(bidder, state, signature, signature_len);
memerr:
	free_state(state);
	archive_set_error(_a, ENOMEM, "Can't allocate memory");
	return (ARCHIVE_FATAL);
}